

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeaderStructs.cpp
# Opt level: O1

void readBup<BupHeaderPS3>(istream *stream,BupHeader *header)

{
  pointer this;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pBVar2;
  bool bVar3;
  char cVar4;
  size_t len;
  long *plVar5;
  size_t i;
  long lVar6;
  ulong uVar7;
  size_type *psVar8;
  char cVar9;
  BupChunk *chunk;
  pointer pBVar10;
  ulong __val;
  pointer pBVar11;
  string __str;
  BupChunkPS3 t_1;
  BupHeaderPS3 h;
  long *local_c0;
  uint local_b8;
  long local_b0 [2];
  string local_a0;
  istream *local_80;
  BupChunk local_78 [4];
  uint32_t local_68;
  uint32_t auStack_58 [3];
  undefined1 local_4c [8];
  undefined8 local_44;
  uint local_38;
  uint local_34;
  
  header->isSwitch = false;
  std::istream::read((char *)stream,(long)local_4c);
  header->ew = (undefined2)local_44;
  header->eh = local_44._2_2_;
  header->width = local_44._4_2_;
  header->height = local_44._6_2_;
  std::vector<BupChunk,_std::allocator<BupChunk>_>::resize(&header->chunks,(ulong)local_38);
  std::vector<BupExpressionChunk,_std::allocator<BupExpressionChunk>_>::resize
            (&header->expChunks,(ulong)local_34);
  std::istream::ignore((long)stream);
  pBVar10 = (header->chunks).super__Vector_base<BupChunk,_std::allocator<BupChunk>_>._M_impl.
            super__Vector_impl_data._M_start;
  pBVar2 = (header->chunks).super__Vector_base<BupChunk,_std::allocator<BupChunk>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pBVar10 != pBVar2) {
    do {
      std::istream::read((char *)stream,(long)local_78);
      pBVar10->offset = local_78[0].offset;
      pBVar10 = pBVar10 + 1;
    } while (pBVar10 != pBVar2);
  }
  local_80 = stream;
  std::istream::ignore((long)stream);
  pBVar11 = (header->expChunks).
            super__Vector_base<BupExpressionChunk,_std::allocator<BupExpressionChunk>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((header->expChunks).
      super__Vector_base<BupExpressionChunk,_std::allocator<BupExpressionChunk>_>._M_impl.
      super__Vector_impl_data._M_finish != pBVar11) {
    paVar1 = &local_a0.field_2;
    __val = 0;
    do {
      this = pBVar11 + __val;
      std::istream::read((char *)local_80,(long)local_78);
      pBVar11[__val].face.offset = local_68;
      std::vector<BupChunk,_std::allocator<BupChunk>_>::resize(&pBVar11[__val].mouths,3);
      pBVar10 = pBVar11[__val].mouths.super__Vector_base<BupChunk,_std::allocator<BupChunk>_>.
                _M_impl.super__Vector_impl_data._M_start;
      lVar6 = 0;
      do {
        pBVar10[lVar6].offset = auStack_58[lVar6];
        lVar6 = lVar6 + 1;
      } while (lVar6 != 3);
      len = strnlen((char *)local_78,0x10);
      iconv_convert_abi_cxx11_(&local_a0,(char *)local_78,len,iconv_toutf);
      std::__cxx11::string::operator=((string *)this,(string *)&local_a0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a0._M_dataplus._M_p != paVar1) {
        operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
      }
      if ((this->name)._M_string_length == 0) {
        cVar9 = '\x01';
        if (9 < __val) {
          uVar7 = __val;
          cVar4 = '\x04';
          do {
            cVar9 = cVar4;
            if (uVar7 < 100) {
              cVar9 = cVar9 + -2;
              goto LAB_0010adab;
            }
            if (uVar7 < 1000) {
              cVar9 = cVar9 + -1;
              goto LAB_0010adab;
            }
            if (uVar7 < 10000) goto LAB_0010adab;
            bVar3 = 99999 < uVar7;
            uVar7 = uVar7 / 10000;
            cVar4 = cVar9 + '\x04';
          } while (bVar3);
          cVar9 = cVar9 + '\x01';
        }
LAB_0010adab:
        local_c0 = local_b0;
        std::__cxx11::string::_M_construct((ulong)&local_c0,cVar9);
        std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_c0,local_b8,__val);
        plVar5 = (long *)std::__cxx11::string::replace((ulong)&local_c0,0,(char *)0x0,0x1166e8);
        psVar8 = (size_type *)(plVar5 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar5 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar8) {
          local_a0.field_2._M_allocated_capacity = *psVar8;
          local_a0.field_2._8_8_ = plVar5[3];
          local_a0._M_dataplus._M_p = (pointer)paVar1;
        }
        else {
          local_a0.field_2._M_allocated_capacity = *psVar8;
          local_a0._M_dataplus._M_p = (pointer)*plVar5;
        }
        local_a0._M_string_length = plVar5[1];
        *plVar5 = (long)psVar8;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
        std::__cxx11::string::operator=((string *)this,(string *)&local_a0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a0._M_dataplus._M_p != paVar1) {
          operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
        }
        if (local_c0 != local_b0) {
          operator_delete(local_c0,local_b0[0] + 1);
        }
      }
      __val = __val + 1;
      pBVar11 = (header->expChunks).
                super__Vector_base<BupExpressionChunk,_std::allocator<BupExpressionChunk>_>._M_impl.
                super__Vector_impl_data._M_start;
    } while (__val < (ulong)((long)(header->expChunks).
                                   super__Vector_base<BupExpressionChunk,_std::allocator<BupExpressionChunk>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)pBVar11 >> 6))
    ;
  }
  return;
}

Assistant:

void readBup(std::istream& stream, BupHeader& header) {
	header.isSwitch = Header::IsSwitch::value;
	Header h = readRaw<Header>(stream);
	copyTo(header, h);

	// Skip bytes for unknown reason
	stream.ignore(h.tbl1.value() * h.skipAmount);

	for (auto& chunk : header.chunks) {
		auto c = readRaw<typename Header::Chunk>(stream);
		copyTo(chunk, c);
	}

	stream.ignore(h.skipAmount2);

	for (size_t i = 0; i < header.expChunks.size(); i++) {
		auto& expChunk = header.expChunks[i];

		auto c = readRaw<typename Header::ExpressionChunk>(stream);
		copyTo(expChunk, c);
		expChunk.name = toUTF8(c.name, strnlen(c.name, sizeof(c.name)));

		if (!c.unkBytesValid()) {
			std::cerr << "Expression " << i << ", " << expChunk.name << ", had unexpected nonzero values in its expression data..." << std::endl;
		}

		if (expChunk.name.empty()) {
			expChunk.name = "expression" + std::to_string(i);
		}
	}
}